

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdapStrategy.cpp
# Opt level: O3

void __thiscall
Vault::LdapStrategy::LdapStrategy(LdapStrategy *this,string *username,string *password)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__LdapStrategy_001c25b0;
  paVar1 = &(this->username_).field_2;
  (this->username_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (username->_M_dataplus)._M_p;
  paVar2 = &username->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&username->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->username_).field_2 + 8) = uVar4;
  }
  else {
    (this->username_)._M_dataplus._M_p = pcVar3;
    (this->username_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->username_)._M_string_length = username->_M_string_length;
  (username->_M_dataplus)._M_p = (pointer)paVar2;
  username->_M_string_length = 0;
  (username->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->password_).field_2;
  (this->password_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (password->_M_dataplus)._M_p;
  paVar2 = &password->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&password->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->password_).field_2 + 8) = uVar4;
  }
  else {
    (this->password_)._M_dataplus._M_p = pcVar3;
    (this->password_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->password_)._M_string_length = password->_M_string_length;
  (password->_M_dataplus)._M_p = (pointer)paVar2;
  password->_M_string_length = 0;
  (password->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

Vault::LdapStrategy::LdapStrategy(std::string username, std::string password)
    : username_(std::move(username)), password_(std::move(password)) {}